

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void __thiscall CTcFormalTypeList::add_untyped_param(CTcFormalTypeList *this)

{
  CTcFormalTypeEle *pCVar1;
  CTcFormalTypeList *pCVar2;
  
  pCVar1 = (CTcFormalTypeEle *)CTcPrsMem::alloc(G_prsmem,0x18);
  pCVar1->name_ = (char *)0x0;
  pCVar2 = (CTcFormalTypeList *)this->tail_;
  if ((CTcFormalTypeList *)this->tail_ == (CTcFormalTypeList *)0x0) {
    pCVar2 = this;
  }
  pCVar2->head_ = pCVar1;
  this->tail_ = pCVar1;
  pCVar1->nxt_ = (CTcFormalTypeEle *)0x0;
  return;
}

Assistant:

void CTcFormalTypeList::add_untyped_param()
{
    add(new (G_prsmem) CTcFormalTypeEle());
}